

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O0

CURLMcode mev_assess(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  CURLMcode CVar1;
  easy_pollset *local_50;
  easy_pollset *last_ps;
  easy_pollset ps;
  connectdata *conn_local;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  if ((multi != (Curl_multi *)0x0) && (multi->socket_cb != (curl_socket_callback)0x0)) {
    ps._24_8_ = conn;
    mev_init_cur_pollset((easy_pollset *)&last_ps,data,conn);
    local_50 = mev_get_last_pollset(data,(connectdata *)ps._24_8_);
    if ((local_50 == (easy_pollset *)0x0) && (ps.sockets[3] != 0)) {
      if (ps._24_8_ == 0) {
        local_50 = mev_add_new_xfer_pollset(data);
      }
      else {
        local_50 = mev_add_new_conn_pollset((connectdata *)ps._24_8_);
      }
      if (local_50 == (easy_pollset *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    if (local_50 != (easy_pollset *)0x0) {
      CVar1 = mev_pollset_diff(multi,data,(connectdata *)ps._24_8_,(easy_pollset *)&last_ps,local_50
                              );
      return CVar1;
    }
  }
  return CURLM_OK;
}

Assistant:

static CURLMcode mev_assess(struct Curl_multi *multi,
                            struct Curl_easy *data,
                            struct connectdata *conn)
{
  if(multi && multi->socket_cb) {
    struct easy_pollset ps, *last_ps;

    mev_init_cur_pollset(&ps, data, conn);
    last_ps = mev_get_last_pollset(data, conn);

    if(!last_ps && ps.num) {
      if(conn)
        last_ps = mev_add_new_conn_pollset(conn);
      else
        last_ps = mev_add_new_xfer_pollset(data);
      if(!last_ps)
        return CURLM_OUT_OF_MEMORY;
    }

    if(last_ps)
      return mev_pollset_diff(multi, data, conn, &ps, last_ps);
    else
      DEBUGASSERT(!ps.num);
  }
  return CURLM_OK;
}